

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O2

void __thiscall Ptex::v2_2::PtexReader::readEditData(PtexReader *this)

{
  uint64_t uVar1;
  bool bVar2;
  undefined8 in_RAX;
  ulong uVar3;
  long pos;
  undefined3 uStack_38;
  uint8_t edittype;
  uint32_t editsize;
  
  pos = this->_editdatapos;
  uVar3 = (this->_extheader).editdatasize + pos;
  uVar1 = (this->_extheader).editdatapos;
  _uStack_38 = in_RAX;
  while (pos < (long)(-(ulong)(uVar1 == 0) | uVar3)) {
    seek(this,pos);
    _uStack_38 = CONCAT13(1,uStack_38);
    bVar2 = readBlock(this,&edittype,1,false);
    if (!bVar2) break;
    bVar2 = readBlock(this,&editsize,4,false);
    if ((!bVar2) || (editsize == 0)) break;
    this->_hasEdits = true;
    pos = (ulong)editsize + this->_pos;
    if (edittype == '\x01') {
      readEditMetaData(this);
    }
    else if (edittype == '\0') {
      readEditFaceData(this);
    }
  }
  uVar3 = (long)(this->_metaedits).
                super__Vector_base<Ptex::v2_2::PtexReader::MetaEdit,_std::allocator<Ptex::v2_2::PtexReader::MetaEdit>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage +
          ((long)&((this->_faceedits).
                   super__Vector_base<Ptex::v2_2::PtexReader::FaceEdit,_std::allocator<Ptex::v2_2::PtexReader::FaceEdit>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->pos -
          ((long)&((this->_metaedits).
                   super__Vector_base<Ptex::v2_2::PtexReader::MetaEdit,_std::allocator<Ptex::v2_2::PtexReader::MetaEdit>_>
                   ._M_impl.super__Vector_impl_data._M_start)->pos +
          (long)&((this->_faceedits).
                  super__Vector_base<Ptex::v2_2::PtexReader::FaceEdit,_std::allocator<Ptex::v2_2::PtexReader::FaceEdit>_>
                  ._M_impl.super__Vector_impl_data._M_start)->pos)) & 0xfffffffffffffff0;
  if (uVar3 != 0) {
    LOCK();
    this->_memUsed = this->_memUsed + uVar3;
    UNLOCK();
  }
  return;
}

Assistant:

void PtexReader::readEditData()
{
    // determine file range to scan for edits
    FilePos pos = FilePos(_editdatapos), endpos;
    if (_extheader.editdatapos > 0) {
        // newer files record the edit data position and size in the extheader
        // note: position will be non-zero even if size is zero
        endpos = FilePos(pos + _extheader.editdatasize);
    }
    else {
        // must have an older file, just read until EOF
        endpos = FilePos((uint64_t)-1);
    }

    while (pos < endpos) {
        seek(pos);
        // read the edit data header
        uint8_t edittype = et_editmetadata;
        uint32_t editsize;
        if (!readBlock(&edittype, sizeof(edittype), /*reporterror*/ false)) break;
        if (!readBlock(&editsize, sizeof(editsize), /*reporterror*/ false)) break;
        if (!editsize) break;
        _hasEdits = true;
        pos = tell() + editsize;
        switch (edittype) {
        case et_editfacedata:   readEditFaceData(); break;
        case et_editmetadata:   readEditMetaData(); break;
        }
    }
    increaseMemUsed(sizeof(_faceedits[0]) * _faceedits.capacity() +
                    sizeof(_metaedits[0]) * _metaedits.capacity());
}